

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

Environment * __thiscall testing::UnitTest::AddEnvironment(UnitTest *this,Environment *env)

{
  Environment *local_10;
  
  if (env == (Environment *)0x0) {
    local_10 = (Environment *)0x0;
  }
  else {
    local_10 = env;
    std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::push_back
              (&this->impl_->environments_,&local_10);
  }
  return local_10;
}

Assistant:

Environment* UnitTest::AddEnvironment(Environment* env) {
  if (env == nullptr) {
    return nullptr;
  }

  impl_->environments().push_back(env);
  return env;
}